

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O3

bool QTestPrivate::appendCharBuffer(QTestCharBuffer *accumulator,QTestCharBuffer *more)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  char *__s;
  char *__s_00;
  
  uVar1 = more->_size;
  __s = more->buf;
  bVar6 = true;
  if (__s == (char *)0x0 || (long)(int)uVar1 < 1) {
    return true;
  }
  pvVar5 = memchr(__s,0,(long)(int)uVar1);
  uVar8 = (int)pvVar5 - (int)__s;
  if (pvVar5 == (void *)0x0) {
    uVar8 = uVar1;
  }
  if ((int)uVar8 < 1) {
    return true;
  }
  iVar2 = accumulator->_size;
  __s_00 = accumulator->buf;
  iVar4 = 0;
  if (__s_00 != (char *)0x0 && 0 < (long)iVar2) {
    pvVar5 = memchr(__s_00,0,(long)iVar2);
    iVar4 = iVar2;
    if (pvVar5 != (void *)0x0) {
      iVar4 = (int)pvVar5 - (int)__s_00;
    }
  }
  iVar7 = iVar4 + uVar8;
  if (iVar7 < 0x200000) {
    if (iVar2 <= iVar7) {
      bVar3 = QTestCharBuffer::reset(accumulator,iVar7 + 1,true);
      if (!bVar3) goto LAB_0011addb;
      __s_00 = accumulator->buf;
      __s = more->buf;
    }
    memcpy(__s_00 + iVar4,__s,(ulong)(uVar8 & 0x7fffffff));
    (__s_00 + iVar4)[uVar8 & 0x7fffffff] = '\0';
  }
  else {
LAB_0011addb:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool appendCharBuffer(QTestCharBuffer *accumulator, const QTestCharBuffer &more)
{
    const auto bufsize = [](const QTestCharBuffer &buf) -> int {
        const int max = buf.size();
        return max > 0 ? int(qstrnlen(buf.constData(), max)) : 0;
    };
    const int extra = bufsize(more);
    if (extra <= 0)
        return true; // Nothing to do, fatuous success

    const int oldsize = bufsize(*accumulator);
    const int newsize = oldsize + extra + 1; // 1 for final '\0'
    if (newsize > MAXSIZE || !accumulator->resize(newsize))
        return false; // too big or unable to grow

    char *tail = accumulator->data() + oldsize;
    memcpy(tail, more.constData(), extra);
    tail[extra] = '\0';
    return true;
}